

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Statement * __thiscall
soul::ResolutionPass::ErrorIgnoringRewritingASTVisitor::visit
          (ErrorIgnoringRewritingASTVisitor *this,IfStatement *i)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  anon_class_16_2_fd512dd6 local_68;
  function<void_()> local_58;
  pool_ptr<soul::AST::Constant> local_28;
  pool_ptr<soul::AST::Constant> constant;
  IfStatement *i_local;
  ErrorIgnoringRewritingASTVisitor *this_local;
  
  constant.object = (Constant *)i;
  if ((i->isConstIf & 1U) == 0) {
    this_local = (ErrorIgnoringRewritingASTVisitor *)
                 RewritingASTVisitor::visit(&this->super_RewritingASTVisitor,i);
  }
  else {
    RewritingASTVisitor::replaceExpression(&this->super_RewritingASTVisitor,&i->condition);
    pEVar2 = pool_ref<soul::AST::Expression>::operator->
                       ((pool_ref<soul::AST::Expression> *)
                        &((constant.object)->super_Expression).kind);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
    if (bVar1) {
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_28);
      bVar1 = soul::Value::getAsBool(&pCVar3->value);
      if (bVar1) {
        RewritingASTVisitor::replaceStatement
                  (&this->super_RewritingASTVisitor,
                   (pool_ref<soul::AST::Statement> *)&(constant.object)->value);
      }
      else {
        bVar1 = pool_ptr<soul::AST::Statement>::operator!=
                          ((pool_ptr<soul::AST::Statement> *)
                           &((constant.object)->value).type.boundingSize,(void *)0x0);
        if (bVar1) {
          RewritingASTVisitor::replaceStatement
                    (&this->super_RewritingASTVisitor,
                     (pool_ptr<soul::AST::Statement> *)&((constant.object)->value).type.boundingSize
                    );
        }
      }
    }
    else {
      this->numFails = this->numFails + 1;
      if ((this->ignoreErrors & 1U) != 0) {
        local_68.i = (IfStatement *)constant.object;
        local_68.this = this;
        std::function<void()>::
        function<soul::ResolutionPass::ErrorIgnoringRewritingASTVisitor::visit(soul::AST::IfStatement&)::_lambda()_1_,void>
                  ((function<void()> *)&local_58,&local_68);
        catchParseErrors(&local_58);
        std::function<void_()>::~function(&local_58);
      }
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_28);
    this_local = (ErrorIgnoringRewritingASTVisitor *)constant.object;
  }
  return (Statement *)this_local;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);

                if (auto constant = i.condition->getAsConstant())
                {
                    if (constant->value.getAsBool())
                        replaceStatement (i.trueBranch);
                    else if (i.falseBranch != nullptr)
                        replaceStatement (i.falseBranch);
                }
                else
                {
                    ++numFails;

                    if (ignoreErrors)
                    {
                        catchParseErrors ([this, &i]
                        {
                            replaceStatement (i.trueBranch);
                            replaceStatement (i.falseBranch);
                        });
                    }
                }

                return i;
            }

            return RewritingASTVisitor::visit (i);
        }